

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_consume_connection(nghttp2_session *session,size_t size)

{
  int iVar1;
  int rv;
  size_t size_local;
  nghttp2_session *session_local;
  
  if ((session->opt_flags & 1) == 0) {
    session_local._4_4_ = -0x207;
  }
  else {
    session_local._4_4_ = session_update_connection_consumed_size(session,size);
    iVar1 = nghttp2_is_fatal(session_local._4_4_);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_consume_connection(nghttp2_session *session, size_t size) {
  int rv;

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}